

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# partition_strategy.c
# Opt level: O3

void av1_ml_prune_rect_partition
               (AV1_COMP *cpi,MACROBLOCK *x,int64_t best_rd,int64_t none_rd,int64_t *split_rd,
               PartitionSearchState *part_state)

{
  buf_2d *ref;
  BLOCK_SIZE bsize;
  byte bVar1;
  AV1_COMP *pAVar2;
  BLOCK_SIZE bsize_00;
  _Bool _Var3;
  int i;
  uint uVar4;
  long lVar5;
  uint uVar6;
  ulong uVar7;
  long lVar8;
  ExtPartController *ext_part_controller;
  BLOCK_SIZE bsize_01;
  int i_1;
  ulong uVar9;
  long lVar11;
  undefined1 auVar10 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  float features [9];
  int split_variance [4];
  buf_2d buf;
  float probs [3];
  float raw_scores [3];
  int in_stack_ffffffffffffd3f8;
  int in_stack_ffffffffffffd400;
  float local_2bfc;
  NN_CONFIG *local_2bf8;
  undefined8 local_2be0;
  float local_2bd8 [8];
  float fStack_2bb8;
  uint local_2ba8 [6];
  buf_2d local_2b90;
  aom_partition_features_t local_2b70;
  aom_partition_decision_t local_2078;
  
  bsize_01 = (BLOCK_SIZE)part_state;
  bsize = (part_state->part_blk_params).bsize;
  uVar9 = (ulong)bsize;
  if (999999999 < best_rd || uVar9 < 3) {
    return;
  }
  lVar5 = 1;
  if (1 < best_rd) {
    lVar5 = best_rd;
  }
  switch(bsize) {
  case BLOCK_16X16:
    local_2bf8 = &av1_rect_partition_nnconfig_16;
    break;
  case BLOCK_16X32:
  case BLOCK_32X16:
  case BLOCK_32X64:
  case BLOCK_64X32:
  case BLOCK_64X128:
  case BLOCK_128X64:
    goto switchD_00a5750c_caseD_7;
  case BLOCK_32X32:
    local_2bf8 = &av1_rect_partition_nnconfig_32;
    local_2bfc = 0.004;
    goto LAB_00a57574;
  case BLOCK_64X64:
    local_2bf8 = &av1_rect_partition_nnconfig_64;
    goto LAB_00a5754b;
  case BLOCK_128X128:
    local_2bf8 = &av1_rect_partition_nnconfig_128;
LAB_00a5754b:
    local_2bfc = 0.002;
    goto LAB_00a57574;
  default:
    if (bsize != BLOCK_8X8) {
      return;
    }
    local_2bf8 = &av1_rect_partition_nnconfig_8;
  }
  local_2bfc = 0.01;
LAB_00a57574:
  lVar8 = 1;
  auVar13 = _DAT_00c0d0d0;
  do {
    if (SUB164(auVar13 ^ _DAT_00bfdd80,4) == -0x80000000 &&
        SUB164(auVar13 ^ _DAT_00bfdd80,0) < -0x7ffffffb) {
      *(undefined4 *)((long)&local_2be0 + lVar8 * 4 + 4) = 0x3f800000;
      local_2bd8[lVar8] = 1.0;
    }
    lVar11 = auVar13._8_8_;
    auVar13._0_8_ = auVar13._0_8_ + 2;
    auVar13._8_8_ = lVar11 + 2;
    lVar8 = lVar8 + 2;
  } while (lVar8 != 7);
  if (none_rd - 1U < 999999999) {
    local_2bd8[0] = (float)none_rd / (float)lVar5;
  }
  lVar8 = 0;
  do {
    if (split_rd[lVar8] - 1U < 999999999) {
      local_2bd8[lVar8 + 1] = (float)split_rd[lVar8] / (float)lVar5;
    }
    lVar8 = lVar8 + 1;
  } while (lVar8 != 4);
  ref = &x->plane[0].src;
  uVar4 = av1_get_perpixel_variance_facade(cpi,&x->e_mbd,ref,bsize,0);
  uVar6 = 1;
  if (1 < (int)uVar4) {
    uVar6 = uVar4;
  }
  bsize_00 = BLOCK_INVALID;
  if (bsize < BLOCK_32X64) {
    (*(code *)(&DAT_00d679a8 + *(int *)(&DAT_00d679a8 + uVar9 * 4)))();
    return;
  }
  if (bsize == BLOCK_64X64) {
    lVar5 = 4;
LAB_00a576ca:
    bsize_00 = subsize_lookup[3][lVar5];
  }
  else if (bsize == BLOCK_128X128) {
    lVar5 = 5;
    goto LAB_00a576ca;
  }
  local_2b90.stride = x->plane[0].src.stride;
  bVar1 = block_size_wide[uVar9];
  uVar9 = 0;
  local_2be0 = cpi;
  do {
    uVar7 = 0;
    if ((uVar9 & 1) != 0) {
      uVar7 = (ulong)(bVar1 >> 1);
    }
    local_2b90.buf =
         ref->buf +
         (ulong)(((uint)(uVar9 >> 1) & 0x7fffffff) * (uint)bVar1 >> 1) * (long)local_2b90.stride +
         uVar7;
    uVar4 = av1_get_perpixel_variance_facade(local_2be0,&x->e_mbd,&local_2b90,bsize_00,0);
    pAVar2 = local_2be0;
    local_2ba8[uVar9] = uVar4;
    uVar9 = uVar9 + 1;
  } while (uVar9 != 4);
  auVar10._0_4_ = (float)(int)uVar6;
  auVar10._4_4_ = auVar10._0_4_;
  auVar10._8_4_ = auVar10._0_4_;
  auVar10._12_4_ = auVar10._0_4_;
  auVar12._0_4_ = (float)(int)local_2ba8[0];
  auVar12._4_4_ = (float)(int)local_2ba8[1];
  auVar12._8_4_ = (float)(int)local_2ba8[2];
  auVar12._12_4_ = (float)(int)local_2ba8[3];
  auVar13 = divps(auVar12,auVar10);
  local_2bd8[5] = auVar13._0_4_;
  local_2bd8._24_8_ = auVar13._4_8_;
  fStack_2bb8 = auVar13._12_4_;
  write_features_to_file
            ((local_2be0->oxcf).partition_info_path,(local_2be0->ext_part_controller).test_mode != 0
             ,local_2bd8,9,5,bsize_01,in_stack_ffffffffffffd3f8,in_stack_ffffffffffffd400);
  if ((((pAVar2->common).current_frame.frame_type & 0xfd) != 0) &&
     (ext_part_controller = &pAVar2->ext_part_controller, ext_part_controller->ready != 0)) {
    local_2b70.id = AOM_EXT_PART_FEATURE_AFTER_SPLIT_PART2;
    local_2b70.after_part_split.f_prune_rect[1] = local_2bd8[1];
    local_2b70.after_part_split.f_prune_rect[0] = local_2bd8[0];
    local_2b70.after_part_split.f_prune_rect[5] = local_2bd8[5];
    local_2b70.after_part_split.f_prune_rect[4] = local_2bd8[4];
    local_2b70.after_part_split.f_prune_rect[2] = local_2bd8[2];
    local_2b70.after_part_split.f_prune_rect[3] = local_2bd8[3];
    local_2b70.after_part_split.f_prune_rect[6] = local_2bd8[6];
    local_2b70.after_part_split.f_prune_rect[7] = local_2bd8[7];
    local_2b70.after_part_split.f_prune_rect[8] = fStack_2bb8;
    av1_ext_part_send_features(ext_part_controller,&local_2b70);
    _Var3 = av1_ext_part_get_partition_decision(ext_part_controller,&local_2078);
    if (_Var3) {
      *&part_state->prune_rect_part = local_2078.prune_rect_part;
      return;
    }
  }
  local_2078.partition_decision[0] = 0;
  local_2078.is_final_decision = 0;
  local_2078.num_nodes = 0;
  (*av1_nn_predict)(local_2bd8,local_2bf8,1,(float *)&local_2078);
  local_2b70.before_part_none.f[1] = 0.0;
  local_2b70.id = AOM_EXT_PART_FEATURE_BEFORE_NONE;
  local_2b70.before_part_none.f[0] = 0.0;
  av1_nn_softmax((float *)&local_2078,(float *)&local_2b70,3);
  if (local_2b70.before_part_none.f[0] <= local_2bfc) {
    part_state->prune_rect_part[0] = 1;
  }
  if (local_2b70.before_part_none.f[1] <= local_2bfc) {
    part_state->prune_rect_part[1] = 1;
  }
switchD_00a5750c_caseD_7:
  return;
}

Assistant:

void av1_ml_prune_rect_partition(AV1_COMP *const cpi, const MACROBLOCK *const x,
                                 int64_t best_rd, int64_t none_rd,
                                 const int64_t *split_rd,
                                 PartitionSearchState *part_state) {
  const PartitionBlkParams *blk_params = &part_state->part_blk_params;
  const int mi_row = blk_params->mi_row, mi_col = blk_params->mi_col;
  const BLOCK_SIZE bsize = blk_params->bsize;

  if (bsize < BLOCK_8X8 || best_rd >= 1000000000) return;
  best_rd = AOMMAX(best_rd, 1);
  const NN_CONFIG *nn_config = NULL;
  const float prob_thresholds[5] = { 0.01f, 0.01f, 0.004f, 0.002f, 0.002f };
  float cur_thresh = 0.0f;
  switch (bsize) {
    case BLOCK_8X8:
      nn_config = &av1_rect_partition_nnconfig_8;
      cur_thresh = prob_thresholds[0];
      break;
    case BLOCK_16X16:
      nn_config = &av1_rect_partition_nnconfig_16;
      cur_thresh = prob_thresholds[1];
      break;
    case BLOCK_32X32:
      nn_config = &av1_rect_partition_nnconfig_32;
      cur_thresh = prob_thresholds[2];
      break;
    case BLOCK_64X64:
      nn_config = &av1_rect_partition_nnconfig_64;
      cur_thresh = prob_thresholds[3];
      break;
    case BLOCK_128X128:
      nn_config = &av1_rect_partition_nnconfig_128;
      cur_thresh = prob_thresholds[4];
      break;
    default: assert(0 && "Unexpected bsize.");
  }
  if (!nn_config) return;

  // 1. Compute input features
  float features[9];

  // RD cost ratios
  for (int i = 0; i < 5; i++) features[i] = 1.0f;
  if (none_rd > 0 && none_rd < 1000000000)
    features[0] = (float)none_rd / (float)best_rd;
  for (int i = 0; i < SUB_PARTITIONS_SPLIT; i++) {
    if (split_rd[i] > 0 && split_rd[i] < 1000000000)
      features[1 + i] = (float)split_rd[i] / (float)best_rd;
  }

  // Variance ratios
  const MACROBLOCKD *const xd = &x->e_mbd;
  int whole_block_variance;
  whole_block_variance = av1_get_perpixel_variance_facade(
      cpi, xd, &x->plane[0].src, bsize, AOM_PLANE_Y);
  whole_block_variance = AOMMAX(whole_block_variance, 1);

  int split_variance[SUB_PARTITIONS_SPLIT];
  const BLOCK_SIZE subsize = get_partition_subsize(bsize, PARTITION_SPLIT);
  struct buf_2d buf;
  buf.stride = x->plane[0].src.stride;
  const int bw = block_size_wide[bsize];
  for (int i = 0; i < SUB_PARTITIONS_SPLIT; ++i) {
    const int x_idx = (i & 1) * bw / 2;
    const int y_idx = (i >> 1) * bw / 2;
    buf.buf = x->plane[0].src.buf + x_idx + y_idx * buf.stride;
    split_variance[i] =
        av1_get_perpixel_variance_facade(cpi, xd, &buf, subsize, AOM_PLANE_Y);
  }

  for (int i = 0; i < SUB_PARTITIONS_SPLIT; i++)
    features[5 + i] = (float)split_variance[i] / (float)whole_block_variance;

  // Write features to file
  write_features_to_file(cpi->oxcf.partition_info_path,
                         cpi->ext_part_controller.test_mode, features,
                         /*feature_size=*/9, 5, bsize, mi_row, mi_col);

  if (ext_ml_model_decision_after_split_part2(
          &cpi->ext_part_controller, frame_is_intra_only(&cpi->common),
          features, &part_state->prune_rect_part[HORZ],
          &part_state->prune_rect_part[VERT])) {
    return;
  }

  // 2. Do the prediction and prune 0-2 partitions based on their probabilities
  float raw_scores[3] = { 0.0f };
  av1_nn_predict(features, nn_config, 1, raw_scores);
  float probs[3] = { 0.0f };
  av1_nn_softmax(raw_scores, probs, 3);

  // probs[0] is the probability of the fact that both rectangular partitions
  // are worse than current best_rd
  if (probs[1] <= cur_thresh) part_state->prune_rect_part[HORZ] = 1;
  if (probs[2] <= cur_thresh) part_state->prune_rect_part[VERT] = 1;
}